

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall
FFont::FFont(FFont *this,char *name,char *nametemplate,int first,int count,int start,int fdlump,
            int spacewidth)

{
  double dVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  FTextureID FVar5;
  FTextureID FVar6;
  CharData *pCVar7;
  void *pvVar8;
  BYTE *pBVar9;
  char *pcVar10;
  FTexture *pFVar11;
  FFontChar1 *this_00;
  uint uVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  FTexture *sourcelump;
  long lVar17;
  bool bVar18;
  char buffer [12];
  char local_3c [12];
  
  this->_vptr_FFont = (_func_int **)&PTR__FFont_006ff028;
  (this->Ranges).Array = (FRemapTable *)0x0;
  (this->Ranges).Most = 0;
  (this->Ranges).Count = 0;
  if (((undefined1)gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
    bVar18 = false;
  }
  else {
    iVar3 = strncmp(nametemplate,"STCFN",5);
    bVar18 = iVar3 == 0;
  }
  this->Lump = fdlump;
  uVar16 = (long)count << 4;
  if (count < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pCVar7 = (CharData *)operator_new__(uVar16);
  uVar16 = (long)count * 8;
  this->Chars = pCVar7;
  if (count < 0) {
    uVar16 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar16);
  pBVar9 = (BYTE *)operator_new__(0x100);
  this->PatchRemap = pBVar9;
  this->FirstChar = first;
  this->LastChar = count + first + -1;
  this->FontHeight = 0;
  this->GlobalKerning = 0;
  pcVar10 = copystring(name);
  this->Name = pcVar10;
  this->Next = FirstFont;
  FirstFont = this;
  this->Cursor = '_';
  if (0 < count) {
    uVar4 = 0x7c - start;
    lVar17 = (long)start + -0x79;
    bVar2 = 0;
    lVar15 = 0;
    do {
      *(undefined8 *)((long)pvVar8 + lVar15) = 0;
      mysnprintf(local_3c,0xc,nametemplate,(ulong)(uint)start);
      FVar5 = FTextureManager::CheckForTexture(&TexMan,local_3c,8,1);
      if ((bVar18) && (lVar17 == 0 && 0 < FVar5.texnum)) {
        FVar6 = FTextureManager::CheckForTexture(&TexMan,"STCFN120",8,1);
        if (0 < FVar6.texnum) {
          FVar6 = FTextureManager::CheckForTexture(&TexMan,"STCFN122",8,1);
          if (0 < FVar6.texnum) goto LAB_0048e38e;
        }
        bVar2 = 1;
        if (count <= (int)uVar4) goto LAB_0048e498;
        if ((uint)FVar5.texnum < TexMan.Textures.Count) {
          pFVar11 = TexMan.Textures.Array[(uint)FVar5.texnum].Texture;
        }
        else {
          pFVar11 = (FTexture *)0x0;
        }
        *(FTexture **)((long)pvVar8 + (long)(int)uVar4 * 8) = pFVar11;
        sourcelump = *(FTexture **)((long)pvVar8 + lVar15);
        bVar2 = 1;
LAB_0048e449:
        if (sourcelump == (FTexture *)0x0) goto LAB_0048e498;
        this_00 = (FFontChar1 *)operator_new(0x70);
        FFontChar1::FFontChar1(this_00,sourcelump);
        pCVar7 = this->Chars;
        *(FFontChar1 **)((long)&pCVar7->Pic + lVar15 * 2) = this_00;
        uVar12 = (uint)((double)((uint)(this_00->super_FTexture).Width * 2) /
                       (this_00->super_FTexture).Scale.X);
        iVar3 = (uVar12 & 1) + ((int)uVar12 >> 1);
      }
      else {
        if (0 < FVar5.texnum) {
LAB_0048e38e:
          if (((uint)FVar5.texnum < TexMan.Textures.Count) &&
             (pFVar11 = TexMan.Textures.Array[(uint)FVar5.texnum].Texture,
             pFVar11 != (FTexture *)0x0)) {
            if ((bool)(bVar2 & (ulong)uVar4 * 8 == lVar15)) {
              sourcelump = (FTexture *)0x0;
            }
            else {
              *(FTexture **)((long)pvVar8 + lVar15) = pFVar11;
              sourcelump = pFVar11;
            }
            dVar1 = (pFVar11->Scale).Y;
            uVar12 = (uint)((double)((uint)pFVar11->Height * 2) / dVar1);
            uVar13 = (uint)((double)(pFVar11->TopOffset * 2) / dVar1);
            iVar14 = (uVar13 & 1) + ((int)uVar13 >> 1);
            iVar3 = -iVar14;
            if (0 < iVar14) {
              iVar3 = iVar14;
            }
            iVar3 = iVar3 + (uVar12 & 1) + ((int)uVar12 >> 1);
            if (this->FontHeight < iVar3) {
              this->FontHeight = iVar3;
            }
            goto LAB_0048e449;
          }
        }
LAB_0048e498:
        pCVar7 = this->Chars;
        *(undefined8 *)((long)&pCVar7->Pic + lVar15 * 2) = 0;
        iVar3 = -0x80000000;
      }
      *(int *)((long)&pCVar7->XMove + lVar15 * 2) = iVar3;
      lVar15 = lVar15 + 8;
      lVar17 = lVar17 + 1;
      start = start + 1;
    } while ((ulong)(uint)count << 3 != lVar15);
  }
  if (spacewidth == -1) {
    uVar4 = 0x4e - first;
    spacewidth = 4;
    if ((int)uVar4 < count && first < 0x4f) {
      if (this->Chars[uVar4].Pic != (FTexture *)0x0) {
        iVar3 = this->Chars[uVar4].XMove;
        spacewidth = (iVar3 - (iVar3 + 1 >> 0x1f)) + 1 >> 1;
      }
    }
  }
  this->SpaceWidth = spacewidth;
  FixXMoves(this);
  (*this->_vptr_FFont[4])(this);
  operator_delete__(pvVar8);
  return;
}

Assistant:

FFont::FFont (const char *name, const char *nametemplate, int first, int count, int start, int fdlump, int spacewidth)
{
	int i;
	FTextureID lump;
	char buffer[12];
	FTexture **charlumps;
	int maxyoffs;
	bool doomtemplate = gameinfo.gametype & GAME_DoomChex ? strncmp (nametemplate, "STCFN", 5) == 0 : false;
	bool stcfn121 = false;

	Lump = fdlump;
	Chars = new CharData[count];
	charlumps = new FTexture *[count];
	PatchRemap = new BYTE[256];
	FirstChar = first;
	LastChar = first + count - 1;
	FontHeight = 0;
	GlobalKerning = false;
	Name = copystring (name);
	Next = FirstFont;
	FirstFont = this;
	Cursor = '_';

	maxyoffs = 0;

	for (i = 0; i < count; i++)
	{
		charlumps[i] = NULL;
		mysnprintf (buffer, countof(buffer), nametemplate, i + start);

		lump = TexMan.CheckForTexture(buffer, FTexture::TEX_MiscPatch);
		if (doomtemplate && lump.isValid() && i + start == 121)
		{ // HACKHACK: Don't load STCFN121 in doom(2), because
		  // it's not really a lower-case 'y' but a '|'.
		  // Because a lot of wads with their own font seem to foolishly
		  // copy STCFN121 and make it a '|' themselves, wads must
		  // provide STCFN120 (x) and STCFN122 (z) for STCFN121 to load as a 'y'.
			if (!TexMan.CheckForTexture("STCFN120", FTexture::TEX_MiscPatch).isValid() ||
				!TexMan.CheckForTexture("STCFN122", FTexture::TEX_MiscPatch).isValid())
			{
				// insert the incorrectly named '|' graphic in its correct position.
				if (count > 124-start) charlumps[124-start] = TexMan[lump];
				lump.SetInvalid();
				stcfn121 = true;
			}
		}

		if (lump.isValid())
		{
			FTexture *pic = TexMan[lump];
			if (pic != NULL)
			{
				// set the lump here only if it represents a valid texture
				if (i != 124-start || !stcfn121)
					charlumps[i] = pic;

				int height = pic->GetScaledHeight();
				int yoffs = pic->GetScaledTopOffset();

				if (yoffs > maxyoffs)
				{
					maxyoffs = yoffs;
				}
				height += abs (yoffs);
				if (height > FontHeight)
				{
					FontHeight = height;
				}
			}
		}

		if (charlumps[i] != NULL)
		{
			Chars[i].Pic = new FFontChar1 (charlumps[i]);
			Chars[i].XMove = Chars[i].Pic->GetScaledWidth();
		}
		else
		{
			Chars[i].Pic = NULL;
			Chars[i].XMove = INT_MIN;
		}
	}

	if (spacewidth != -1)
	{
		SpaceWidth = spacewidth;
	}
	else if ('N'-first >= 0 && 'N'-first < count && Chars['N' - first].Pic != NULL)
	{
		SpaceWidth = (Chars['N' - first].XMove + 1) / 2;
	}
	else
	{
		SpaceWidth = 4;
	}

	FixXMoves();

	LoadTranslations();

	delete[] charlumps;
}